

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O1

double __thiscall libDAI::LCLin::run(LCLin *this)

{
  unsigned_long uVar1;
  pointer pTVar2;
  _func_int *p_Var3;
  undefined *puVar4;
  pointer puVar5;
  pointer puVar6;
  int iVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  undefined4 extraout_var_00;
  clock_t cVar9;
  undefined4 extraout_var_01;
  long lVar10;
  undefined4 extraout_var_02;
  ulong uVar11;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  size_t sVar12;
  iterator iVar13;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  iterator iVar14;
  long lVar15;
  pointer pTVar16;
  long lVar17;
  size_t i;
  ulong uVar18;
  size_t t;
  size_t k;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Diffs diffs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> update_seq;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  allocator_type local_b1;
  double local_b0;
  Diffs local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_58;
  value_type_conflict2 local_38;
  
  iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar7) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&local_a8,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)local_a8.super_vector<double,_std::allocator<double>_>.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start,
                        (long)local_a8.super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"...",3);
    if ((pointer *)
        local_a8.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != &local_a8.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
      operator_delete(local_a8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (1 < CONCAT44(extraout_var_00,iVar7)) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  cVar9 = toc();
  iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar7) + 0x28))
                     ((long *)CONCAT44(extraout_var_01,iVar7));
  Diffs::Diffs(&local_a8,lVar10,1.0);
  dVar19 = InitCavityDists(this,&(this->Props).cavainame,&(this->Props).cavaiopts);
  if (this->_maxdiff < dVar19) {
    this->_maxdiff = dVar19;
  }
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar10 = 0;
  uVar18 = 0;
  local_b0 = (double)cVar9;
  while( true ) {
    iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x28))
                       ((long *)CONCAT44(extraout_var_02,iVar7));
    if (uVar11 <= uVar18) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (&local_58,
               (value_type *)
               ((long)&(((this->_beliefs).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar10));
    uVar18 = uVar18 + 1;
    lVar10 = lVar10 + 0x38;
  }
  iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,
             *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x48) -
             *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x40) >> 4,&local_38,&local_b1);
  for (uVar18 = 0;
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this),
      uVar18 < (ulong)(*(long *)(CONCAT44(extraout_var_04,iVar7) + 0x48) -
                       *(long *)(CONCAT44(extraout_var_04,iVar7) + 0x40) >> 4); uVar18 = uVar18 + 1)
  {
    local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar18] = uVar18;
  }
  this->_iterations = 0;
  if ((this->Props).maxiter != 0) {
    do {
      puVar6 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar5 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13._M_current = &local_a8._def;
      if (local_a8._maxsize <=
          (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar13._M_current = local_a8._maxpos._M_current;
      }
      if (*iVar13._M_current <= (this->Props).tol) break;
      if ((((this->Props).updates.v == SEQRND) &&
          (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish)) &&
         (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + 1 !=
          local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        lVar10 = 8;
        do {
          iVar7 = rand();
          lVar15 = (long)iVar7 % ((lVar10 >> 3) + 1);
          if (lVar10 != lVar15 * 8) {
            uVar1 = *(unsigned_long *)((long)puVar5 + lVar10);
            *(unsigned_long *)((long)puVar5 + lVar10) = puVar5[lVar15];
            puVar5[lVar15] = uVar1;
          }
          lVar15 = lVar10 + 8;
          lVar10 = lVar10 + 8;
        } while ((pointer)((long)puVar5 + lVar15) != puVar6);
      }
      for (uVar18 = 0;
          iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this),
          uVar18 < (ulong)(*(long *)(CONCAT44(extraout_var_05,iVar7) + 0x48) -
                           *(long *)(CONCAT44(extraout_var_05,iVar7) + 0x40) >> 4);
          uVar18 = uVar18 + 1) {
        iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        lVar10 = *(long *)(CONCAT44(extraout_var_06,iVar7) + 0x40);
        update(this,*(size_t *)
                     (lVar10 + local_70.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar18] * 0x10),
               *(size_t *)
                (lVar10 + 8 +
                local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar18] * 0x10));
      }
      uVar18 = 0;
      while( true ) {
        iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x28))
                           ((long *)CONCAT44(extraout_var_07,iVar7));
        if (uVar11 <= uVar18) break;
        CalcBelief(this,uVar18);
        pTVar2 = (this->_beliefs).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar19 = -1.0;
        if (pTVar2[uVar18]._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            *(pointer *)
             &pTVar2[uVar18]._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
           ) {
          pTVar16 = local_58.
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar18;
          dVar19 = -1.0;
          if ((pTVar16->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar16->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar10 = *(long *)&pTVar2[uVar18]._p._p.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar15 = (long)pTVar2[uVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish - lVar10;
            if (lVar15 == 0) {
              dVar19 = 0.0;
            }
            else {
              lVar15 = lVar15 >> 3;
              auVar20 = ZEXT816(0);
              lVar17 = 0;
              auVar22._8_8_ = 0x7fffffffffffffff;
              auVar22._0_8_ = 0x7fffffffffffffff;
              do {
                auVar21._8_8_ = 0;
                auVar21._0_8_ =
                     *(double *)(lVar10 + lVar17 * 8) -
                     (pTVar16->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17];
                auVar21 = vandpd_avx(auVar21,auVar22);
                auVar20 = vmaxsd_avx(auVar21,auVar20);
                dVar19 = auVar20._0_8_;
                lVar17 = lVar17 + 1;
              } while (lVar15 + (ulong)(lVar15 == 0) != lVar17);
            }
          }
        }
        Diffs::push(&local_a8,dVar19);
        TFactor<double>::operator=
                  (local_58.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar18,
                   (this->_beliefs).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar18);
        uVar18 = uVar18 + 1;
      }
      iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      puVar4 = Name;
      if (2 < CONCAT44(extraout_var_08,iVar7)) {
        if (Name == (undefined *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
        }
        else {
          sVar12 = strlen(Name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar4,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"::run:  maxdiff ",0x10);
        iVar13._M_current = &local_a8._def;
        if (local_a8._maxsize <=
            (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_a8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3)) {
          iVar13._M_current = local_a8._maxpos._M_current;
        }
        poVar8 = std::ostream::_M_insert<double>(*iVar13._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," after ",7);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      uVar18 = this->_iterations + 1;
      this->_iterations = uVar18;
    } while (uVar18 < (this->Props).maxiter);
  }
  iVar13._M_current = &local_a8._def;
  iVar14._M_current = iVar13._M_current;
  if (local_a8._maxsize <=
      (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar14._M_current = local_a8._maxpos._M_current;
  }
  if (this->_maxdiff < *iVar14._M_current) {
    this->_maxdiff = *iVar14._M_current;
  }
  iVar7 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (CONCAT44(extraout_var_09,iVar7) != 0) {
    iVar14._M_current = iVar13._M_current;
    if (local_a8._maxsize <=
        (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3)) {
      iVar14._M_current = local_a8._maxpos._M_current;
    }
    p_Var3 = (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6];
    if (*iVar14._M_current <= (this->Props).tol) {
      iVar7 = (*p_Var3)(this);
      puVar4 = Name;
      if (1 < CONCAT44(extraout_var_11,iVar7)) {
        if (Name == (undefined *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
        }
        else {
          sVar12 = strlen(Name);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar4,sVar12);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"::run:  ",8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"converged in ",0xd);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," passes (",9);
      toc();
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    }
    else {
      iVar7 = (*p_Var3)(this);
      if (CONCAT44(extraout_var_10,iVar7) == 1) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      puVar4 = Name;
      if (Name == (undefined *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5f93b0);
      }
      else {
        sVar12 = strlen(Name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,puVar4,sVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"::run:  WARNING: not converged within ",0x26);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," passes (",9);
      toc();
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," clocks)...final maxdiff:",0x19);
      iVar14._M_current = iVar13._M_current;
      if (local_a8._maxsize <=
          (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3)) {
        iVar14._M_current = local_a8._maxpos._M_current;
      }
      poVar8 = std::ostream::_M_insert<double>(*iVar14._M_current);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    }
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if (local_a8._maxsize <=
      (ulong)((long)local_a8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    iVar13._M_current = local_a8._maxpos._M_current;
  }
  local_b0 = *iVar13._M_current;
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_58);
  if (local_a8.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_a8.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_b0;
}

Assistant:

double LCLin::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 2 )
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        double md = InitCavityDists(Props.cavainame, Props.cavaiopts);
        if( md > _maxdiff )
            _maxdiff = md;

        vector<Factor> old_beliefs;
        for(size_t i=0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        vector<size_t> update_seq(grm().nrEdges(),0);
        for( size_t k=0; k < grm().nrEdges(); k++ )
            update_seq[k] = k;

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            // Sequential updates
            if( Props.updates == UpdateType::SEQRND )
                random_shuffle( update_seq.begin(), update_seq.end() );
            
            for( size_t t=0; t < grm().nrEdges(); t++ ) {
                FactorGraph::edge_type iI = grm().edge(update_seq[t]);
                update( iI.first, iI.second );
            }

            // compare new beliefs with old ones
            for(size_t i=0; i < grm().nrVars(); i++ ) {
                CalcBelief(i);
                diffs.push( dist( beliefV(i), old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = beliefV(i);
            }

            if( Verbose() >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << Name << "::run:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }